

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void __thiscall
soul::ResolutionPass::TypeResolver::resolveVariableDeclarationInitialValue
          (TypeResolver *this,VariableDeclaration *v,Type *type)

{
  pool_ptr<soul::AST::Expression> *this_00;
  size_t *psVar1;
  Allocator *this_01;
  bool bVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  TypeCast *pTVar5;
  pool_ptr<soul::AST::Expression> local_58;
  Type local_50;
  pool_ptr<soul::AST::Expression> local_38;
  
  this_00 = &v->initialValue;
  local_38.object = (v->initialValue).object;
  bVar2 = AST::isResolvedAsValue(&local_38);
  if (bVar2) {
    pEVar3 = pool_ptr<soul::AST::Expression>::operator->(this_00);
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_50,pEVar3);
    bVar2 = Type::isIdentical(&local_50,type);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_50.structure);
    if (bVar2) goto LAB_002474e3;
    pEVar3 = pool_ptr<soul::AST::Expression>::operator->(this_00);
    pEVar4 = pool_ptr<soul::AST::Expression>::operator*(this_00);
    SanityCheckPass::expectSilentCastPossible
              (&(pEVar3->super_Statement).super_ASTObject.context,type,pEVar4);
  }
  else {
    local_58.object = this_00->object;
    bVar2 = is_type<soul::AST::CommaSeparatedList,soul::AST::Expression>(&local_58);
    if (!bVar2) {
      return;
    }
  }
  this_01 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
  pEVar3 = pool_ptr<soul::AST::Expression>::operator->(this_00);
  pEVar4 = pool_ptr<soul::AST::Expression>::operator*(this_00);
  pTVar5 = PoolAllocator::
           allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type_const&,soul::AST::Expression&>
                     (&this_01->pool,&(pEVar3->super_Statement).super_ASTObject.context,type,pEVar4)
  ;
  this_00->object = &pTVar5->super_Expression;
LAB_002474e3:
  (v->declaredType).object = (Expression *)0x0;
  psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.itemsReplaced;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void resolveVariableDeclarationInitialValue (AST::VariableDeclaration& v, const Type& type)
        {
            if (AST::isResolvedAsValue (v.initialValue))
            {
                if (! v.initialValue->getResultType().isIdentical (type))
                {
                    SanityCheckPass::expectSilentCastPossible (v.initialValue->context, type, *v.initialValue);
                    v.initialValue = allocator.allocate<AST::TypeCast> (v.initialValue->context, type, *v.initialValue);
                }

                v.declaredType = {};
                ++itemsReplaced;
            }
            else if (is_type<AST::CommaSeparatedList> (v.initialValue))
            {
                v.initialValue = allocator.allocate<AST::TypeCast> (v.initialValue->context, type, *v.initialValue);
                v.declaredType = {};
                ++itemsReplaced;
            }
        }